

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

CubeFaceIntCoords tcu::remapCubeEdgeCoords(CubeFaceIntCoords *origCoords,int size)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  CubeFaceIntCoords CVar8;
  
  uVar4 = origCoords->s;
  uVar6 = origCoords->t;
  if ((size <= (int)uVar4 || (int)uVar4 < 0) || (size <= (int)uVar6 || (int)uVar6 < 0)) {
    uVar3 = 6;
    uVar2 = 0xffffffff;
    if ((size <= (int)uVar4 || (int)uVar4 < 0) && (size <= (int)uVar6 || (int)uVar6 < 0)) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar5 = size;
      if ((int)uVar4 < size) {
        uVar5 = uVar4;
      }
      uVar7 = (ulong)uVar5;
      if ((int)uVar4 < -1) {
        uVar7 = 0xffffffff;
      }
      uVar4 = size;
      if ((int)uVar6 < size) {
        uVar4 = uVar6;
      }
      uVar2 = (ulong)uVar4;
      if ((int)uVar6 < -1) {
        uVar2 = 0xffffffff;
      }
      uVar5 = (uint)uVar2;
      uVar4 = (uint)uVar7;
      switch(origCoords->face) {
      case CUBEFACE_NEGATIVE_X:
        uVar5 = ~uVar5 + size;
        uVar2 = uVar7;
        uVar4 = 0;
        break;
      case CUBEFACE_POSITIVE_X:
        uVar6 = size - 1;
        uVar5 = uVar6 - uVar5;
        uVar2 = (ulong)(uVar6 - uVar4);
        uVar4 = uVar6;
        break;
      case CUBEFACE_NEGATIVE_Y:
        uVar2 = (ulong)(~uVar5 + size);
        uVar5 = 0;
        break;
      case CUBEFACE_POSITIVE_Y:
        uVar5 = size - 1;
        break;
      case CUBEFACE_NEGATIVE_Z:
        uVar5 = (size + -1) - uVar5;
        uVar2 = 0;
        uVar4 = (size + -1) - uVar4;
        break;
      case CUBEFACE_POSITIVE_Z:
        uVar5 = (size - 1U) - uVar5;
        uVar2 = (ulong)(size - 1U);
        break;
      default:
        uVar5 = 0;
        uVar2 = 0;
        uVar4 = 0;
      }
      if (uVar4 == 0xffffffff) {
        uVar6 = ~uVar5 + size;
        uVar3 = 0;
      }
      else {
        uVar1 = (uint)uVar2;
        if (uVar4 == size) {
          uVar4 = (size + -1) - uVar1;
          uVar3 = 1;
          uVar6 = (size + -1) - uVar5;
        }
        else if (uVar5 == 0xffffffff) {
          uVar6 = ~uVar1 + size;
          uVar3 = 2;
        }
        else if (uVar5 == size) {
          uVar3 = 3;
          uVar6 = uVar1;
        }
        else {
          if (uVar1 == 0xffffffff) {
            uVar2 = (ulong)((size + -1) - uVar4);
            uVar6 = (size + -1) - uVar5;
            uVar3 = 4;
            goto LAB_00324d87;
          }
          uVar6 = 0xffffffff;
          uVar2 = 0xffffffff;
          if (uVar1 != size) goto LAB_00324d87;
          uVar6 = ~uVar5 + size;
          uVar3 = 5;
        }
        uVar2 = (ulong)uVar4;
      }
    }
  }
  else {
    uVar2._0_4_ = origCoords->face;
    uVar2._4_4_ = origCoords->s;
    uVar3 = uVar2 & 0xffffffff;
    uVar2 = uVar2 >> 0x20;
  }
LAB_00324d87:
  CVar8._0_8_ = uVar2 << 0x20 | uVar3;
  CVar8.t = uVar6;
  return CVar8;
}

Assistant:

CubeFaceIntCoords remapCubeEdgeCoords (const CubeFaceIntCoords& origCoords, int size)
{
	bool uInBounds = de::inBounds(origCoords.s, 0, size);
	bool vInBounds = de::inBounds(origCoords.t, 0, size);

	if (uInBounds && vInBounds)
		return origCoords;

	if (!uInBounds && !vInBounds)
		return CubeFaceIntCoords(CUBEFACE_LAST, -1, -1);

	IVec2 coords(wrap(Sampler::CLAMP_TO_BORDER, origCoords.s, size),
				 wrap(Sampler::CLAMP_TO_BORDER, origCoords.t, size));
	IVec3 canonizedCoords;

	// Map the uv coordinates to canonized 3d coordinates.

	switch (origCoords.face)
	{
		case CUBEFACE_NEGATIVE_X: canonizedCoords = IVec3(0,					size-1-coords.y(),	coords.x());			break;
		case CUBEFACE_POSITIVE_X: canonizedCoords = IVec3(size-1,				size-1-coords.y(),	size-1-coords.x());		break;
		case CUBEFACE_NEGATIVE_Y: canonizedCoords = IVec3(coords.x(),			0,					size-1-coords.y());		break;
		case CUBEFACE_POSITIVE_Y: canonizedCoords = IVec3(coords.x(),			size-1,				coords.y());			break;
		case CUBEFACE_NEGATIVE_Z: canonizedCoords = IVec3(size-1-coords.x(),	size-1-coords.y(),	0);						break;
		case CUBEFACE_POSITIVE_Z: canonizedCoords = IVec3(coords.x(),			size-1-coords.y(),	size-1);				break;
		default: DE_ASSERT(false);
	}

	// Find an appropriate face to re-map the coordinates to.

	if (canonizedCoords.x() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_X, IVec2(canonizedCoords.z(), size-1-canonizedCoords.y()));

	if (canonizedCoords.x() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_X, IVec2(size-1-canonizedCoords.z(), size-1-canonizedCoords.y()));

	if (canonizedCoords.y() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_Y, IVec2(canonizedCoords.x(), size-1-canonizedCoords.z()));

	if (canonizedCoords.y() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_Y, IVec2(canonizedCoords.x(), canonizedCoords.z()));

	if (canonizedCoords.z() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_Z, IVec2(size-1-canonizedCoords.x(), size-1-canonizedCoords.y()));

	if (canonizedCoords.z() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_Z, IVec2(canonizedCoords.x(), size-1-canonizedCoords.y()));

	DE_ASSERT(false);
	return CubeFaceIntCoords(CUBEFACE_LAST, IVec2(-1));
}